

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

void __thiscall Messages::Person_PhoneNumber::SharedDtor(Person_PhoneNumber *this)

{
  string *psVar1;
  pointer pcVar2;
  ulong uVar3;
  LogMessage *pLVar4;
  LogFinisher local_49;
  LogMessage local_48 [56];
  
  uVar3 = *(ulong *)&this->field_0x8;
  if ((uVar3 & 1) != 0) {
    uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  if (uVar3 != 0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O3/proto/messages.pb.cc"
               ,0xe1);
    pLVar4 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_48,"CHECK failed: GetArena() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(local_48);
  }
  psVar1 = (this->number_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if ((psVar1 != (string *)0x0) &&
       (pcVar2 = (psVar1->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &psVar1->field_2)) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  return;
}

Assistant:

void Person_PhoneNumber::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  number_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}